

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleRowDown4_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst,int dst_width)

{
  int x;
  int dst_width_local;
  uint8_t *dst_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_ptr_local;
  
  dst_local = dst;
  src_ptr_local = src_ptr;
  for (x = 0; x < dst_width + -1; x = x + 2) {
    *dst_local = src_ptr_local[2];
    dst_local[1] = src_ptr_local[6];
    dst_local = dst_local + 2;
    src_ptr_local = src_ptr_local + 8;
  }
  if ((dst_width & 1U) != 0) {
    *dst_local = src_ptr_local[2];
  }
  return;
}

Assistant:

void ScaleRowDown4_C(const uint8_t* src_ptr,
                     ptrdiff_t src_stride,
                     uint8_t* dst,
                     int dst_width) {
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src_ptr[2];
    dst[1] = src_ptr[6];
    dst += 2;
    src_ptr += 8;
  }
  if (dst_width & 1) {
    dst[0] = src_ptr[2];
  }
}